

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

int unsetenv(char *__name)

{
  bool bVar1;
  int iVar2;
  stCoRoutine_t *psVar3;
  void *pvVar4;
  stCoSysEnvArr_t *psVar5;
  stCoSysEnv_t name;
  char *local_20;
  undefined8 local_18;
  
  psVar5 = (stCoSysEnvArr_t *)__name;
  if (g_sys_unsetenv_func == (unsetenv_pfn_t)0x0) {
    psVar5 = (stCoSysEnvArr_t *)0xffffffffffffffff;
    g_sys_unsetenv_func = (unsetenv_pfn_t)dlsym(0xffffffffffffffff,"unsetenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((bVar1 && _ZL11g_co_sysenv_0 != 0) && (psVar3 = co_self(), psVar3 != (stCoRoutine_t *)0x0)) {
    if (psVar3->pvEnv == (void *)0x0) {
      psVar5 = dup_co_sysenv_arr(psVar5);
      psVar3->pvEnv = psVar5;
    }
    local_18 = 0;
    local_20 = __name;
    pvVar4 = bsearch(&local_20,*psVar3->pvEnv,*(size_t *)((long)psVar3->pvEnv + 8),0x10,
                     co_sysenv_comp);
    if (pvVar4 != (void *)0x0) {
      if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar4 + 8));
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      return 0;
    }
  }
  iVar2 = (*g_sys_unsetenv_func)(__name);
  return iVar2;
}

Assistant:

int unsetenv(const char *n)
{
	HOOK_SYS_FUNC( unsetenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();
		if( self )
		{
			if( !self->pvEnv )
			{
				self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
			}
			stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

			stCoSysEnv_t name = { (char*)n,0 };

			stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

			if( e )
			{
				if( e->value )
				{
					free( e->value );
					e->value = 0;
				}
				return 0;
			}
		}

	}
	return g_sys_unsetenv_func( n );
}